

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

FMStructDescList REVPlookup_format_structs(CManager_conflict cm,char *format_name)

{
  int iVar1;
  size_t sVar2;
  void *__ptr;
  undefined8 uVar3;
  FMStructDescList p_Var4;
  ulong uVar5;
  ulong uVar6;
  char local_3f;
  char local_3e;
  undefined1 local_3d;
  int x;
  CManager_conflict local_38;
  
  local_38 = cm;
  sVar2 = strlen(format_name);
  uVar5 = (long)((ulong)(uint)((int)sVar2 >> 0x1f) << 0x20 | sVar2 & 0xffffffff) / 2;
  iVar1 = (int)uVar5;
  __ptr = INT_CMmalloc((long)iVar1);
  uVar5 = uVar5 & 0xffffffff;
  if (iVar1 < 1) {
    uVar5 = 0;
  }
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_3d = 0;
    local_3f = format_name[uVar6 * 2];
    local_3e = format_name[uVar6 * 2 + 1];
    __isoc99_sscanf(&local_3f,"%x",&x);
    *(undefined1 *)((long)__ptr + uVar6) = (undefined1)x;
  }
  uVar3 = FMformat_from_ID(local_38->evp->fmc,__ptr);
  free(__ptr);
  p_Var4 = (FMStructDescList)format_list_of_FMFormat(uVar3);
  return p_Var4;
}

Assistant:

extern FMStructDescList
REVPlookup_format_structs(CManager cm, char *format_name)
{
    FMFormat format;
    int slen = (int)strlen(format_name);
    int i;
    unsigned char *id = malloc(slen/2);
    for (i=0; i < slen/2; i++) {
        int x;
        char tmp[3] = {0, 0, 0};
        tmp[0] = format_name[2*i];
        tmp[1] = format_name[2*i + 1];
        sscanf(tmp, "%x", &x);
        id[i] = (unsigned char) x;
    }
    format = FMformat_from_ID(cm->evp->fmc, (char*)id);
    free(id);
    return format_list_of_FMFormat(format);
}